

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<TPZFlopCounter>::Subst_Backward
          (TPZMatrix<TPZFlopCounter> *this,TPZFMatrix<TPZFlopCounter> *B)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_01;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar8;
  double local_38;
  int extraout_var_00;
  
  lVar3 = (B->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow;
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar4 = 0;
  if ((lVar3 == CONCAT44(extraout_var,iVar2)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    lVar3 = CONCAT44(extraout_var_00,iVar2);
    iVar4 = 1;
    if (lVar3 != 0 && -1 < extraout_var_00) {
      do {
        lVar7 = lVar3 + -1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar7);
        if (0 < (B->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol) {
          lVar6 = 0;
          do {
            iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
            lVar5 = CONCAT44(extraout_var_01,iVar2);
            dVar8 = 0.0;
            while (lVar3 < lVar5) {
              lVar5 = lVar5 + -1;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,lVar7,lVar5);
              (*(B->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(B,lVar5,lVar6);
              dVar8 = dVar8 + extraout_XMM0_Qa_01 * extraout_XMM0_Qa_00;
              TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
              TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
            }
            (*(B->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(B,lVar7,lVar6);
            TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
            TPZFlopCounter::gCount.fCount[2] = TPZFlopCounter::gCount.fCount[2] + 1;
            local_38 = (extraout_XMM0_Qa_02 - dVar8) / extraout_XMM0_Qa;
            (*(B->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(B,lVar7,lVar6,&local_38);
            lVar6 = lVar6 + 1;
          } while (lVar6 < (B->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol);
        }
        bVar1 = 1 < lVar3;
        lVar3 = lVar7;
      } while (bVar1);
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}